

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::tryPumpFrom
          (BlockedPumpTo *this,AsyncInputStream *input,uint64_t amount2)

{
  PromiseArena *params;
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  PromiseArenaMember *pPVar4;
  Fault FVar5;
  void *pvVar6;
  PromiseArena *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar7;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_03;
  PromiseArena *pPVar8;
  Maybe<kj::Promise<unsigned_long>_> MVar9;
  OwnPromiseNode local_90;
  DebugExpression<bool> _kjCondition;
  PromiseArenaMember *local_80;
  OwnPromiseNode local_68;
  TransformPromiseNodeBase *local_60;
  BlockedPumpTo *local_58;
  OwnPromiseNode local_50;
  Fault f;
  
  pPVar4 = local_80;
  _kjCondition.value = input[7]._vptr_AsyncInputStream == (_func_int **)0x0;
  if (_kjCondition.value) {
    pPVar8 = (PromiseArena *)
             ((long)input[5]._vptr_AsyncInputStream - (long)input[6]._vptr_AsyncInputStream);
    if (in_RCX < pPVar8) {
      pPVar8 = in_RCX;
    }
    (**(code **)(*input[4]._vptr_AsyncInputStream + 0x10))
              (&_kjCondition,input[4]._vptr_AsyncInputStream,amount2,pPVar8);
    if (_kjCondition.value == false) {
      *(undefined1 *)
       &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = 0;
      aVar7 = extraout_RDX;
    }
    else {
      params = (PromiseArena *)(input + 7);
      local_90.ptr = (PromiseNode *)local_80;
      local_80 = (PromiseArenaMember *)0x0;
      pp_Var1 = input[2]._vptr_AsyncInputStream;
      pPVar2 = pPVar4->arena;
      local_58 = this;
      if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar4 - (long)pPVar2) < 0x50) {
        pvVar6 = operator_new(0x400);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  ((TransformPromiseNodeBase *)((long)pvVar6 + 0x3b0),&local_90,
                   kj::_::
                   TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1366:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_32_4_450de9d3_for_func::operator());
        *(undefined ***)((long)pvVar6 + 0x3b0) = &PTR_destroy_00646ea0;
        *(AsyncInputStream **)((long)pvVar6 + 0x3d0) = input;
        *(uint64_t *)((long)pvVar6 + 0x3d8) = amount2;
        *(PromiseArena **)((long)pvVar6 + 0x3e0) = in_RCX;
        *(PromiseArena **)((long)pvVar6 + 1000) = pPVar8;
        *(_func_int ***)((long)pvVar6 + 0x3f0) = pp_Var1;
        *(PromiseArena **)((long)pvVar6 + 0x3f8) = params;
        *(void **)((long)pvVar6 + 0x3b8) = pvVar6;
        local_50.ptr = (PromiseNode *)((long)pvVar6 + 0x3b0);
      }
      else {
        pPVar4->arena = (PromiseArena *)0x0;
        local_60 = (TransformPromiseNodeBase *)(pPVar4 + -5);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (local_60,&local_90,
                   kj::_::
                   TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1366:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_32_4_450de9d3_for_func::operator());
        pPVar4[-5]._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00646ea0;
        pPVar4[-3]._vptr_PromiseArenaMember = (_func_int **)input;
        pPVar4[-3].arena = (PromiseArena *)amount2;
        pPVar4[-2]._vptr_PromiseArenaMember = (_func_int **)in_RCX;
        pPVar4[-2].arena = pPVar8;
        pPVar4[-1]._vptr_PromiseArenaMember = pp_Var1;
        pPVar4[-1].arena = params;
        pPVar4[-5].arena = pPVar2;
        local_50.ptr = &local_60->super_PromiseNode;
      }
      f.exception = (Exception *)anon_var_dwarf_a0474c;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_68,&local_50,(SourceLocation *)&f);
      OVar3.ptr = local_50.ptr;
      if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
        local_50.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
      }
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
                ((PromiseDisposer *)&f,(Canceler *)params,(Promise<unsigned_long> *)&local_68);
      FVar5 = f;
      OVar3.ptr = local_68.ptr;
      aVar7 = extraout_RDX_00;
      if (&(local_68.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_68.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
        aVar7 = extraout_RDX_01;
      }
      this = local_58;
      OVar3.ptr = local_90.ptr;
      *(undefined1 *)
       &(local_58->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = 1;
      (local_58->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = (_func_int **)FVar5.exception;
      if (&(local_90.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_90.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
        aVar7 = extraout_RDX_02;
      }
    }
    if ((_kjCondition.value == true) && (local_80 != (PromiseArenaMember *)0x0)) {
      kj::_::PromiseDisposer::dispose(local_80);
      aVar7 = extraout_RDX_03;
    }
    MVar9.ptr.field_1 = aVar7;
    MVar9.ptr._0_8_ = this;
    return (Maybe<kj::Promise<unsigned_long>_>)MVar9.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x550,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}